

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool parsePara(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  long lVar3;
  long in_RSI;
  int in_EDI;
  string branch;
  int i;
  char *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff94;
  undefined1 in_stack_ffffffffffffff95;
  undefined1 in_stack_ffffffffffffff96;
  undefined1 in_stack_ffffffffffffff97;
  allocator local_39;
  string local_38 [36];
  int local_14;
  long local_10;
  int local_8;
  byte local_1;
  
  local_14 = 1;
  local_10 = in_RSI;
  local_8 = in_EDI;
  do {
    if (local_8 <= local_14) {
      local_1 = elf_file_name != (char *)0x0;
LAB_00105757:
      return (bool)(local_1 & 1);
    }
    if (**(char **)(local_10 + (long)local_14 * 8) == '-') {
      switch(*(undefined1 *)(*(long *)(local_10 + (long)local_14 * 8) + 1)) {
      case 0x62:
        if (local_8 <= local_14 + 1) {
          local_1 = 0;
          goto LAB_00105757;
        }
        lVar3 = (long)local_14;
        local_14 = local_14 + 1;
        pcVar1 = *(char **)(local_10 + 8 + lVar3 * 8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_38,pcVar1,&local_39);
        std::allocator<char>::~allocator((allocator<char> *)&local_39);
        in_stack_ffffffffffffff97 =
             std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_ffffffffffffff97,
                                      CONCAT16(in_stack_ffffffffffffff96,
                                               CONCAT15(in_stack_ffffffffffffff95,
                                                        CONCAT14(in_stack_ffffffffffffff94,
                                                                 in_stack_ffffffffffffff90)))),
                             in_stack_ffffffffffffff88);
        if ((bool)in_stack_ffffffffffffff97) {
          strategy = AT;
LAB_001056ed:
          bVar2 = false;
        }
        else {
          in_stack_ffffffffffffff96 =
               std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(in_stack_ffffffffffffff97,
                                        CONCAT16(in_stack_ffffffffffffff96,
                                                 CONCAT15(in_stack_ffffffffffffff95,
                                                          CONCAT14(in_stack_ffffffffffffff94,
                                                                   in_stack_ffffffffffffff90)))),
                               in_stack_ffffffffffffff88);
          if ((bool)in_stack_ffffffffffffff96) {
            strategy = NT;
            goto LAB_001056ed;
          }
          in_stack_ffffffffffffff95 =
               std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(in_stack_ffffffffffffff97,
                                        CONCAT16(in_stack_ffffffffffffff96,
                                                 CONCAT15(in_stack_ffffffffffffff95,
                                                          CONCAT14(in_stack_ffffffffffffff94,
                                                                   in_stack_ffffffffffffff90)))),
                               in_stack_ffffffffffffff88);
          if ((bool)in_stack_ffffffffffffff95) {
            strategy = BTFNT;
            goto LAB_001056ed;
          }
          in_stack_ffffffffffffff94 =
               std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(in_stack_ffffffffffffff97,
                                        CONCAT16(in_stack_ffffffffffffff96,
                                                 CONCAT15(in_stack_ffffffffffffff95,
                                                          CONCAT14(in_stack_ffffffffffffff94,
                                                                   in_stack_ffffffffffffff90)))),
                               in_stack_ffffffffffffff88);
          if ((bool)in_stack_ffffffffffffff94) {
            strategy = BPB;
            goto LAB_001056ed;
          }
          local_1 = 0;
          bVar2 = true;
        }
        std::__cxx11::string::~string(local_38);
        if (bVar2) goto LAB_00105757;
        break;
      default:
        local_1 = 0;
        goto LAB_00105757;
      case 100:
        dump_history = true;
        break;
      case 0x73:
        single_step = true;
        break;
      case 0x76:
        verbose = true;
      }
    }
    else {
      elf_file_name = *(char **)(local_10 + (long)local_14 * 8);
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

bool parsePara(int argc, char **argv) {
    for (int i = 1; i < argc; i++) {
        if (argv[i][0] == '-') {
            switch (argv[i][1]) {
                case 'v':
                    verbose = true;
                    break;
                case 's':
                    single_step = true;
                    break;
                case 'd':
                    dump_history = true;
                    break;
                case 'b':
                    if (i + 1 < argc) {
                        string branch = argv[++i];
                        if (branch == "AT") {
                            strategy = BranchPredictor::Strategy::AT;
                        } else if (branch == "NT") {
                            strategy = BranchPredictor::Strategy::NT;
                        } else if (branch == "BTFNT") {
                            strategy = BranchPredictor::Strategy::BTFNT;
                        } else if (branch == "BPB") {
                            strategy = BranchPredictor::Strategy::BPB;
                        } else {
                            return false;
                        }
                    } else {
                        return false;
                    }
                    break;
                default:
                    return false;
            }
        } else {
            elf_file_name = argv[i];
        }
    }

    return elf_file_name != nullptr;
}